

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlFdOpen(char *filename,int write,int *out)

{
  int iVar1;
  int *piVar2;
  int local_3c;
  int ret;
  int fd;
  int flags;
  char *fromUri;
  int *out_local;
  char *pcStack_18;
  int write_local;
  char *filename_local;
  
  _fd = (char *)0x0;
  *out = -1;
  if (filename == (char *)0x0) {
    filename_local._4_4_ = 0x73;
  }
  else {
    fromUri = (char *)out;
    out_local._4_4_ = write;
    pcStack_18 = filename;
    iVar1 = xmlConvertUriToPath(filename,(char **)&fd);
    if (iVar1 < 0) {
      filename_local._4_4_ = 2;
    }
    else {
      if (_fd != (char *)0x0) {
        pcStack_18 = _fd;
      }
      if (out_local._4_4_ == 0) {
        ret = 0;
      }
      else {
        ret = 0x241;
      }
      iVar1 = open64(pcStack_18,ret,0x1b6);
      if (iVar1 < 0) {
        piVar2 = __errno_location();
        if ((*piVar2 == 2) || (piVar2 = __errno_location(), *piVar2 == 0x16)) {
          local_3c = 0x5f4;
        }
        else {
          piVar2 = __errno_location();
          local_3c = xmlIOErr(*piVar2);
        }
      }
      else {
        *(int *)fromUri = iVar1;
        local_3c = 0;
      }
      (*xmlFree)(_fd);
      filename_local._4_4_ = local_3c;
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int
xmlFdOpen(const char *filename, int write, int *out) {
    char *fromUri = NULL;
    int flags;
    int fd;
    int ret;

    *out = -1;
    if (filename == NULL)
        return(XML_ERR_ARGUMENT);

    if (xmlConvertUriToPath(filename, &fromUri) < 0)
        return(XML_ERR_NO_MEMORY);

    if (fromUri != NULL)
        filename = fromUri;

#if defined(_WIN32)
    {
        wchar_t *wpath;

        wpath = __xmlIOWin32UTF8ToWChar(filename);
        if (wpath == NULL) {
            xmlFree(fromUri);
            return(XML_ERR_NO_MEMORY);
        }
        if (write)
            flags = _O_WRONLY | _O_CREAT | _O_TRUNC;
        else
            flags = _O_RDONLY;
	fd = _wopen(wpath, flags | _O_BINARY, 0666);
        xmlFree(wpath);
    }
#else
    if (write)
        flags = O_WRONLY | O_CREAT | O_TRUNC;
    else
        flags = O_RDONLY;
    fd = open(filename, flags, 0666);
#endif /* WIN32 */

    if (fd < 0) {
        /*
         * Windows and possibly other platforms return EINVAL
         * for invalid filenames.
         */
        if ((errno == ENOENT) || (errno == EINVAL)) {
            ret = XML_IO_ENOENT;
        } else {
            ret = xmlIOErr(errno);
        }
    } else {
        *out = fd;
        ret = XML_ERR_OK;
    }

    xmlFree(fromUri);
    return(ret);
}